

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O3

void Gia_Iso2ManCollectOrder2_rec(Gia_Man_t *p,int Id,Vec_Int_t *vVec)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (p->nTravIdsAlloc <= Id) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x22c,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  if (p->pTravIds[Id] == p->nTravIds) {
    return;
  }
  p->pTravIds[Id] = p->nTravIds;
  if ((Id < 0) || (p->nObjs <= Id)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar3 = *(ulong *)(p->pObjs + (uint)Id);
  uVar2 = (uint)uVar3;
  uVar5 = uVar3 & 0x1fffffff;
  uVar4 = (uint)(uVar3 >> 0x20);
  if (uVar5 == 0x1fffffff || (int)uVar2 < 0) {
    if (-1 < (int)uVar2 || (int)uVar5 == 0x1fffffff) {
      if ((~uVar2 & 0x9fffffff) == 0) {
        if (((~uVar3 & 0x1fffffff1fffffff) != 0) &&
           (p->vCis->nSize - p->nRegs <= (int)(uVar4 & 0x1fffffff))) {
LAB_006cbe90:
          __assert_fail("Gia_ObjIsConst0(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIso2.c"
                        ,0x198,"void Gia_Iso2ManCollectOrder2_rec(Gia_Man_t *, int, Vec_Int_t *)");
        }
      }
      else if ((~uVar3 & 0x1fffffff1fffffff) != 0) goto LAB_006cbe90;
      goto LAB_006cbe73;
    }
  }
  else {
    pGVar1 = p->pObjs + (uint)Id;
    if (pGVar1[-(ulong)(uVar4 & 0x1fffffff)].Value < pGVar1[-uVar5].Value) {
      Gia_Iso2ManCollectOrder2_rec(p,Id - (uVar4 & 0x1fffffff),vVec);
      uVar3 = *(ulong *)pGVar1;
    }
    else {
      Gia_Iso2ManCollectOrder2_rec(p,Id - (uVar2 & 0x1fffffff),vVec);
      uVar3 = (ulong)*(uint *)&pGVar1->field_0x4;
    }
  }
  Gia_Iso2ManCollectOrder2_rec(p,Id - ((uint)uVar3 & 0x1fffffff),vVec);
LAB_006cbe73:
  Vec_IntPush(vVec,Id);
  return;
}

Assistant:

void Gia_Iso2ManCollectOrder2_rec( Gia_Man_t * p, int Id, Vec_Int_t * vVec )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return;
    Gia_ObjSetTravIdCurrentId(p, Id);
    pObj = Gia_ManObj( p, Id );
    if ( Gia_ObjIsAnd(pObj) )
    {
        if ( Gia_ObjFanin0(pObj)->Value <= Gia_ObjFanin1(pObj)->Value )
        {
            Gia_Iso2ManCollectOrder2_rec( p, Gia_ObjFaninId0(pObj, Id), vVec );
            Gia_Iso2ManCollectOrder2_rec( p, Gia_ObjFaninId1(pObj, Id), vVec );
        }
        else
        {
            Gia_Iso2ManCollectOrder2_rec( p, Gia_ObjFaninId1(pObj, Id), vVec );
            Gia_Iso2ManCollectOrder2_rec( p, Gia_ObjFaninId0(pObj, Id), vVec );
        }
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        Gia_Iso2ManCollectOrder2_rec( p, Gia_ObjFaninId0(pObj, Id), vVec );
    }
    else if ( Gia_ObjIsPi(p, pObj) )
    {
    }
    else assert( Gia_ObjIsConst0(pObj) );
    Vec_IntPush( vVec, Id );
}